

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

void __thiscall
Js::JavascriptGenerator::SetFrameSlots
          (JavascriptGenerator *this,RegSlot slotCount,Type *frameSlotArray)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  InterpreterStackFrame *pIVar5;
  FunctionBody *this_00;
  undefined4 *puVar6;
  void **ppvVar7;
  uint local_24;
  RegSlot i;
  Type *frameSlotArray_local;
  RegSlot slotCount_local;
  JavascriptGenerator *this_local;
  
  pIVar5 = Memory::WriteBarrierPtr<Js::InterpreterStackFrame>::operator->(&this->frame);
  this_00 = InterpreterStackFrame::GetFunctionBody(pIVar5);
  RVar4 = FunctionBody::GetLocalsCount(this_00);
  if (RVar4 != slotCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
                                ,0x86,
                                "(this->frame->GetFunctionBody()->GetLocalsCount() == slotCount)",
                                "Unexpected mismatch in frame slot count for generated.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  for (local_24 = 0; local_24 < slotCount; local_24 = local_24 + 1) {
    ppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(frameSlotArray + local_24));
    pvVar1 = *ppvVar7;
    pIVar5 = GetFrame(this);
    *(void **)(pIVar5 + (ulong)local_24 * 8 + 0x160) = pvVar1;
  }
  return;
}

Assistant:

void JavascriptGenerator::SetFrameSlots(Js::RegSlot slotCount, Field(Var)* frameSlotArray)
{
    AssertMsg(this->frame->GetFunctionBody()->GetLocalsCount() == slotCount, 
        "Unexpected mismatch in frame slot count for generated.");

    for (Js::RegSlot i = 0; i < slotCount; i++)
        GetFrame()->m_localSlots[i] = frameSlotArray[i];
}